

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O0

int main(int argc,char **argv)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __result;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last_00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __result_00;
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  ostream *poVar4;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_16;
  double z_1;
  ostringstream error_message_15;
  double sum_1;
  ostringstream error_message_14;
  int frame_index;
  vector<double,_std::allocator<double>_> data_1;
  ostringstream error_message_13;
  double z;
  ostringstream error_message_12;
  double sum;
  ostringstream error_message_11;
  ostringstream error_message_10;
  ostringstream error_message_9;
  Buffer buffer;
  StatisticsAccumulation statistics_accumulation;
  vector<double,_std::allocator<double>_> data;
  vector<double,_std::allocator<double>_> histogram;
  ostringstream error_message_8;
  HistogramCalculation histogram_calculation;
  istream *input_stream;
  ostringstream error_message_7;
  ifstream ifs;
  ostringstream error_message_6;
  char *input_file;
  ostringstream error_message_5;
  int num_input_files;
  ostringstream error_message_4;
  ostringstream error_message_3;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  bool normalization_flag;
  double upper_bound;
  double lower_bound;
  int num_bin;
  int output_interval;
  option *in_stack_ffffffffffffdd98;
  vector<double,_std::allocator<double>_> *pvVar5;
  anon_class_8_1_54a3981a in_stack_ffffffffffffdda0;
  allocator *paVar6;
  undefined7 in_stack_ffffffffffffdda8;
  undefined1 in_stack_ffffffffffffddaf;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffddb0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffddb8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffddc0;
  int *in_stack_ffffffffffffddd0;
  ostream *in_stack_ffffffffffffddd8;
  ostream *in_stack_ffffffffffffdde0;
  HistogramCalculation *in_stack_ffffffffffffdde8;
  int write_size;
  int in_stack_ffffffffffffddf0;
  undefined2 in_stack_ffffffffffffddf4;
  undefined1 in_stack_ffffffffffffddf6;
  undefined1 in_stack_ffffffffffffddf7;
  StatisticsAccumulation *in_stack_ffffffffffffddf8;
  int *in_stack_ffffffffffffde00;
  int *actual_read_size;
  char *local_2168;
  char *local_2120;
  Buffer *in_stack_ffffffffffffdef8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffdf00;
  ostringstream *poVar7;
  StatisticsAccumulation *in_stack_ffffffffffffdf08;
  bool local_2092;
  ostringstream *in_stack_ffffffffffffdf88;
  undefined5 in_stack_ffffffffffffdf90;
  byte in_stack_ffffffffffffdf95;
  undefined1 in_stack_ffffffffffffdf96;
  undefined1 in_stack_ffffffffffffdf97;
  allocator local_2049;
  string local_2048 [32];
  ostringstream local_2028 [376];
  double *local_1eb0;
  double local_1ea8;
  double *local_1ea0;
  double *local_1e98;
  double *local_1e90;
  double local_1e88;
  allocator local_1e79;
  string local_1e78 [32];
  ostringstream local_1e58 [376];
  double *local_1ce0;
  double *local_1cd8;
  ostream *local_1cd0;
  allocator local_1cc1;
  string local_1cc0 [32];
  ostringstream local_1ca0 [376];
  int local_1b28;
  int local_1b21 [8];
  allocator local_1b01;
  string local_1b00 [32];
  ostringstream local_1ae0 [376];
  double *local_1968;
  double local_1960;
  double *local_1958;
  double *local_1950;
  double *local_1948;
  double local_1940;
  allocator local_1931;
  string local_1930 [32];
  ostringstream local_1910 [376];
  double *local_1798;
  double *local_1790;
  double local_1788;
  allocator local_1779;
  string local_1778 [32];
  ostringstream local_1758 [383];
  allocator local_15d9;
  string local_15d8 [32];
  ostringstream local_15b8 [383];
  allocator local_1439;
  string local_1438 [32];
  ostringstream local_1418 [504];
  StatisticsAccumulation local_1220 [2];
  ostream local_11e0 [31];
  allocator local_11c1;
  string local_11c0 [32];
  ostringstream local_11a0 [376];
  HistogramCalculation local_1028;
  char *local_ff8;
  int local_ff0;
  allocator local_fe9;
  string local_fe8 [32];
  ostringstream local_fc8 [376];
  char local_e50 [527];
  allocator local_c41;
  string local_c40 [32];
  ostringstream local_c20 [376];
  char *local_aa8;
  allocator local_a99;
  string local_a98 [32];
  ostringstream local_a78 [376];
  int local_900;
  allocator local_8f9;
  string local_8f8 [32];
  ostringstream local_8d8 [383];
  allocator local_759;
  string local_758 [32];
  ostringstream local_738 [383];
  allocator local_5b9;
  string local_5b8 [39];
  allocator local_591;
  string local_590 [32];
  ostringstream local_570 [383];
  allocator local_3f1;
  string local_3f0 [39];
  allocator local_3c9;
  string local_3c8 [32];
  ostringstream local_3a8 [383];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  ostringstream local_1e0 [399];
  allocator local_51;
  string local_50 [32];
  int local_30;
  byte local_29;
  double local_28;
  double local_20;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = -1;
  local_18 = 10;
  local_20 = 0.0;
  local_28 = 1.0;
  local_29 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_30 = ya_getopt_long((int)((ulong)in_stack_ffffffffffffddb0._M_current >> 0x20),
                                   (char **)CONCAT17(in_stack_ffffffffffffddaf,
                                                     in_stack_ffffffffffffdda8),
                                   (char *)in_stack_ffffffffffffdda0.z,in_stack_ffffffffffffdd98,
                                   (int *)0x10378f), pcVar1 = ya_optarg, local_30 != -1) {
    switch(local_30) {
    case 0x62:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_228,pcVar1,&local_229);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_ffffffffffffddaf,in_stack_ffffffffffffdda8),
                         (int *)in_stack_ffffffffffffdda0.z);
      local_2092 = !bVar2 || local_18 < 1;
      std::__cxx11::string::~string(local_228);
      std::allocator<char>::~allocator((allocator<char> *)&local_229);
      if (local_2092) {
        std::__cxx11::ostringstream::ostringstream(local_3a8);
        std::operator<<((ostream *)local_3a8,
                        "The argument for the -b option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3c8,"histogram",&local_3c9);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffdf97,
                            CONCAT16(in_stack_ffffffffffffdf96,
                                     CONCAT15(in_stack_ffffffffffffdf95,in_stack_ffffffffffffdf90)))
                   ,in_stack_ffffffffffffdf88);
        std::__cxx11::string::~string(local_3c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3a8);
        return local_4;
      }
      break;
    default:
      anon_unknown.dwarf_1a02::PrintUsage(in_stack_ffffffffffffdde0);
      return 1;
    case 0x68:
      anon_unknown.dwarf_1a02::PrintUsage(in_stack_ffffffffffffdde0);
      return 0;
    case 0x6c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f0,pcVar1,&local_3f1);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)CONCAT17(in_stack_ffffffffffffddaf,in_stack_ffffffffffffdda8),
                         (double *)in_stack_ffffffffffffdda0.z);
      std::__cxx11::string::~string(local_3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_570);
        std::operator<<((ostream *)local_570,"The argument for the -l option must be numeric");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_590,"histogram",&local_591);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffdf97,
                            CONCAT16(in_stack_ffffffffffffdf96,
                                     CONCAT15(in_stack_ffffffffffffdf95,in_stack_ffffffffffffdf90)))
                   ,in_stack_ffffffffffffdf88);
        std::__cxx11::string::~string(local_590);
        std::allocator<char>::~allocator((allocator<char> *)&local_591);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_570);
        return local_4;
      }
      break;
    case 0x6e:
      local_29 = 1;
      break;
    case 0x74:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,pcVar1,&local_51);
      in_stack_ffffffffffffdf97 =
           sptk::ConvertStringToInteger
                     ((string *)CONCAT17(in_stack_ffffffffffffddaf,in_stack_ffffffffffffdda8),
                      (int *)in_stack_ffffffffffffdda0.z);
      in_stack_ffffffffffffdf95 = !(bool)in_stack_ffffffffffffdf97 || local_14 < 1;
      in_stack_ffffffffffffdf96 = in_stack_ffffffffffffdf95;
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      if ((in_stack_ffffffffffffdf95 & 1) != 0) {
        poVar7 = local_1e0;
        std::__cxx11::ostringstream::ostringstream(poVar7);
        std::operator<<((ostream *)poVar7,
                        "The argument for the -t option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_200,"histogram",&local_201);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffdf97,
                            CONCAT16(in_stack_ffffffffffffdf96,
                                     CONCAT15(in_stack_ffffffffffffdf95,in_stack_ffffffffffffdf90)))
                   ,(ostringstream *)poVar7);
        std::__cxx11::string::~string(local_200);
        std::allocator<char>::~allocator((allocator<char> *)&local_201);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1e0);
        return local_4;
      }
      break;
    case 0x75:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5b8,pcVar1,&local_5b9);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)CONCAT17(in_stack_ffffffffffffddaf,in_stack_ffffffffffffdda8),
                         (double *)in_stack_ffffffffffffdda0.z);
      std::__cxx11::string::~string(local_5b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_738);
        std::operator<<((ostream *)local_738,"The argument for the -u option must be numeric");
        paVar6 = &local_759;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_758,"histogram",paVar6);
        sptk::PrintErrorMessage
                  ((string *)
                   CONCAT17(in_stack_ffffffffffffdf97,
                            CONCAT16(in_stack_ffffffffffffdf96,
                                     CONCAT15(in_stack_ffffffffffffdf95,in_stack_ffffffffffffdf90)))
                   ,in_stack_ffffffffffffdf88);
        std::__cxx11::string::~string(local_758);
        std::allocator<char>::~allocator((allocator<char> *)&local_759);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_738);
        return local_4;
      }
    }
  }
  if (local_28 <= local_20) {
    poVar7 = local_8d8;
    std::__cxx11::ostringstream::ostringstream(poVar7);
    std::operator<<((ostream *)poVar7,"Upper bound must be greater than lower bound");
    paVar6 = &local_8f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8f8,"histogram",paVar6);
    sptk::PrintErrorMessage
              ((string *)
               CONCAT17(in_stack_ffffffffffffdf97,
                        CONCAT16(in_stack_ffffffffffffdf96,
                                 CONCAT15(in_stack_ffffffffffffdf95,in_stack_ffffffffffffdf90))),
               in_stack_ffffffffffffdf88);
    std::__cxx11::string::~string(local_8f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_8d8);
    return local_4;
  }
  local_900 = local_8 - ya_optind;
  if (1 < local_900) {
    std::__cxx11::ostringstream::ostringstream(local_a78);
    std::operator<<((ostream *)local_a78,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a98,"histogram",&local_a99);
    sptk::PrintErrorMessage
              ((string *)
               CONCAT17(in_stack_ffffffffffffdf97,
                        CONCAT16(in_stack_ffffffffffffdf96,
                                 CONCAT15(in_stack_ffffffffffffdf95,in_stack_ffffffffffffdf90))),
               in_stack_ffffffffffffdf88);
    std::__cxx11::string::~string(local_a98);
    std::allocator<char>::~allocator((allocator<char> *)&local_a99);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_a78);
    return local_4;
  }
  if (local_900 == 0) {
    local_2120 = (char *)0x0;
  }
  else {
    local_2120 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_aa8 = local_2120;
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_c20);
    std::operator<<((ostream *)local_c20,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c40,"histogram",&local_c41);
    sptk::PrintErrorMessage
              ((string *)
               CONCAT17(in_stack_ffffffffffffdf97,
                        CONCAT16(in_stack_ffffffffffffdf96,
                                 CONCAT15(in_stack_ffffffffffffdf95,in_stack_ffffffffffffdf90))),
               in_stack_ffffffffffffdf88);
    std::__cxx11::string::~string(local_c40);
    std::allocator<char>::~allocator((allocator<char> *)&local_c41);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_c20);
    return local_4;
  }
  std::ifstream::ifstream(local_e50);
  pcVar1 = local_aa8;
  if (local_aa8 != (char *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_e50,(_Ios_Openmode)pcVar1);
    bVar3 = std::ios::fail();
    if ((bVar3 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_fc8);
      poVar4 = std::operator<<((ostream *)local_fc8,"Cannot open file ");
      std::operator<<(poVar4,local_aa8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_fe8,"histogram",&local_fe9);
      sptk::PrintErrorMessage
                ((string *)
                 CONCAT17(in_stack_ffffffffffffdf97,
                          CONCAT16(in_stack_ffffffffffffdf96,
                                   CONCAT15(in_stack_ffffffffffffdf95,in_stack_ffffffffffffdf90))),
                 in_stack_ffffffffffffdf88);
      std::__cxx11::string::~string(local_fe8);
      std::allocator<char>::~allocator((allocator<char> *)&local_fe9);
      local_4 = 1;
      local_ff0 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_fc8);
      goto LAB_0010585e;
    }
  }
  bVar3 = std::ifstream::is_open();
  if ((bVar3 & 1) == 0) {
    local_2168 = (char *)&std::cin;
  }
  else {
    local_2168 = local_e50;
  }
  local_ff8 = local_2168;
  sptk::HistogramCalculation::HistogramCalculation(&local_1028,local_18,local_20,local_28);
  bVar2 = sptk::HistogramCalculation::IsValid(&local_1028);
  if (bVar2) {
    std::allocator<double>::allocator((allocator<double> *)0x10484b);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffddc0,(size_type)in_stack_ffffffffffffddb8._M_current,
               (allocator_type *)in_stack_ffffffffffffddb0._M_current);
    std::allocator<double>::~allocator((allocator<double> *)0x104877);
    if (local_14 == -1) {
      std::allocator<double>::allocator((allocator<double> *)0x10489e);
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_ffffffffffffddc0,(size_type)in_stack_ffffffffffffddb8._M_current,
                 (allocator_type *)in_stack_ffffffffffffddb0._M_current);
      std::allocator<double>::~allocator((allocator<double> *)0x1048c7);
      sptk::StatisticsAccumulation::StatisticsAccumulation(local_1220,local_18 + -1,1,false,false);
      sptk::StatisticsAccumulation::Buffer::Buffer((Buffer *)in_stack_ffffffffffffddb0._M_current);
      do {
        pvVar5 = (vector<double,_std::allocator<double>_> *)0x0;
        bVar2 = sptk::ReadStream<double>
                          ((bool)in_stack_ffffffffffffddf6,in_stack_ffffffffffffddf0,
                           (int)((ulong)in_stack_ffffffffffffdde8 >> 0x20),
                           (int)in_stack_ffffffffffffdde8,
                           (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdde0,
                           (istream *)in_stack_ffffffffffffddd8,in_stack_ffffffffffffde00);
        if (!bVar2) {
          bVar2 = sptk::StatisticsAccumulation::GetSum
                            (in_stack_ffffffffffffddf8,
                             (Buffer *)
                             CONCAT17(in_stack_ffffffffffffddf7,
                                      CONCAT16(in_stack_ffffffffffffddf6,
                                               CONCAT24(in_stack_ffffffffffffddf4,
                                                        in_stack_ffffffffffffddf0))),
                             (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdde8);
          write_size = (int)((ulong)in_stack_ffffffffffffdde8 >> 0x20);
          if (!bVar2) {
            std::__cxx11::ostringstream::ostringstream(local_1758);
            std::operator<<((ostream *)local_1758,"Failed to get histogram");
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1778,"histogram",&local_1779);
            sptk::PrintErrorMessage
                      ((string *)
                       CONCAT17(in_stack_ffffffffffffdf97,
                                CONCAT16(in_stack_ffffffffffffdf96,
                                         CONCAT15(in_stack_ffffffffffffdf95,
                                                  in_stack_ffffffffffffdf90))),
                       in_stack_ffffffffffffdf88);
            std::__cxx11::string::~string(local_1778);
            std::allocator<char>::~allocator((allocator<char> *)&local_1779);
            local_4 = 1;
            local_ff0 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_1758);
            goto LAB_00105187;
          }
          if ((local_29 & 1) != 0) {
            local_1790 = (double *)std::vector<double,_std::allocator<double>_>::begin(pvVar5);
            local_1798 = (double *)std::vector<double,_std::allocator<double>_>::end(pvVar5);
            __last._M_current._7_1_ = in_stack_ffffffffffffddaf;
            __last._M_current._0_7_ = in_stack_ffffffffffffdda8;
            local_1788 = std::
                         accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                                   (in_stack_ffffffffffffddb0,__last,in_stack_ffffffffffffdda0.z);
            if ((local_1788 == 0.0) && (!NAN(local_1788))) {
              std::__cxx11::ostringstream::ostringstream(local_1910);
              std::operator<<((ostream *)local_1910,"Failed to calculate normalized histogram");
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1930,"histogram",&local_1931);
              sptk::PrintErrorMessage
                        ((string *)
                         CONCAT17(in_stack_ffffffffffffdf97,
                                  CONCAT16(in_stack_ffffffffffffdf96,
                                           CONCAT15(in_stack_ffffffffffffdf95,
                                                    in_stack_ffffffffffffdf90))),
                         in_stack_ffffffffffffdf88);
              std::__cxx11::string::~string(local_1930);
              std::allocator<char>::~allocator((allocator<char> *)&local_1931);
              local_4 = 1;
              local_ff0 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_1910);
              goto LAB_00105187;
            }
            local_1940 = 1.0 / local_1788;
            local_1948 = (double *)std::vector<double,_std::allocator<double>_>::begin(pvVar5);
            local_1950 = (double *)std::vector<double,_std::allocator<double>_>::end(pvVar5);
            local_1958 = (double *)std::vector<double,_std::allocator<double>_>::begin(pvVar5);
            local_1960 = local_1940;
            __result._M_current._7_1_ = in_stack_ffffffffffffddaf;
            __result._M_current._0_7_ = in_stack_ffffffffffffdda8;
            local_1968 = (double *)
                         std::
                         transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,main::__0>
                                   (in_stack_ffffffffffffddb8,in_stack_ffffffffffffddb0,__result,
                                    in_stack_ffffffffffffdda0);
          }
          bVar2 = sptk::WriteStream<double>
                            (in_stack_ffffffffffffddf0,write_size,
                             (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdde0,
                             in_stack_ffffffffffffddd8,in_stack_ffffffffffffddd0);
          if (bVar2) {
            local_ff0 = 0;
          }
          else {
            std::__cxx11::ostringstream::ostringstream(local_1ae0);
            std::operator<<((ostream *)local_1ae0,"Failed to write histogram");
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1b00,"histogram",&local_1b01);
            sptk::PrintErrorMessage
                      ((string *)
                       CONCAT17(in_stack_ffffffffffffdf97,
                                CONCAT16(in_stack_ffffffffffffdf96,
                                         CONCAT15(in_stack_ffffffffffffdf95,
                                                  in_stack_ffffffffffffdf90))),
                       in_stack_ffffffffffffdf88);
            std::__cxx11::string::~string(local_1b00);
            std::allocator<char>::~allocator((allocator<char> *)&local_1b01);
            local_4 = 1;
            local_ff0 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_1ae0);
          }
          goto LAB_00105187;
        }
        bVar2 = sptk::HistogramCalculation::Run
                          (in_stack_ffffffffffffdde8,
                           (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdde0,
                           (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffddd8);
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream(local_1418);
          std::operator<<((ostream *)local_1418,"Failed to calculate histogram");
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1438,"histogram",&local_1439);
          sptk::PrintErrorMessage
                    ((string *)
                     CONCAT17(in_stack_ffffffffffffdf97,
                              CONCAT16(in_stack_ffffffffffffdf96,
                                       CONCAT15(in_stack_ffffffffffffdf95,in_stack_ffffffffffffdf90)
                                      )),in_stack_ffffffffffffdf88);
          std::__cxx11::string::~string(local_1438);
          std::allocator<char>::~allocator((allocator<char> *)&local_1439);
          local_4 = 1;
          local_ff0 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_1418);
          goto LAB_00105187;
        }
        bVar2 = sptk::StatisticsAccumulation::Run
                          (in_stack_ffffffffffffdf08,in_stack_ffffffffffffdf00,
                           in_stack_ffffffffffffdef8);
      } while (bVar2);
      std::__cxx11::ostringstream::ostringstream(local_15b8);
      std::operator<<((ostream *)local_15b8,"Failed to accumulate histogram");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_15d8,"histogram",&local_15d9);
      sptk::PrintErrorMessage
                ((string *)
                 CONCAT17(in_stack_ffffffffffffdf97,
                          CONCAT16(in_stack_ffffffffffffdf96,
                                   CONCAT15(in_stack_ffffffffffffdf95,in_stack_ffffffffffffdf90))),
                 in_stack_ffffffffffffdf88);
      std::__cxx11::string::~string(local_15d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_15d9);
      local_4 = 1;
      local_ff0 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_15b8);
LAB_00105187:
      sptk::StatisticsAccumulation::Buffer::~Buffer((Buffer *)in_stack_ffffffffffffdda0.z);
      sptk::StatisticsAccumulation::~StatisticsAccumulation(local_1220);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffddb0._M_current);
    }
    else {
      actual_read_size = local_1b21;
      std::allocator<double>::allocator((allocator<double> *)0x10520f);
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_ffffffffffffddc0,(size_type)in_stack_ffffffffffffddb8._M_current,
                 (allocator_type *)in_stack_ffffffffffffddb0._M_current);
      std::allocator<double>::~allocator((allocator<double> *)0x105235);
      local_1b28 = 0;
      while( true ) {
        pvVar5 = (vector<double,_std::allocator<double>_> *)0x0;
        bVar2 = sptk::ReadStream<double>
                          ((bool)in_stack_ffffffffffffddf6,in_stack_ffffffffffffddf0,
                           (int)((ulong)in_stack_ffffffffffffdde8 >> 0x20),
                           (int)in_stack_ffffffffffffdde8,
                           (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdde0,
                           (istream *)in_stack_ffffffffffffddd8,actual_read_size);
        if (!bVar2) break;
        in_stack_ffffffffffffddf6 =
             sptk::HistogramCalculation::Run
                       (in_stack_ffffffffffffdde8,
                        (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdde0,
                        (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffddd8);
        if (!(bool)in_stack_ffffffffffffddf6) {
          std::__cxx11::ostringstream::ostringstream(local_1ca0);
          std::operator<<((ostream *)local_1ca0,"Failed to calculate histogram");
          paVar6 = &local_1cc1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1cc0,"histogram",paVar6);
          sptk::PrintErrorMessage
                    ((string *)
                     CONCAT17(in_stack_ffffffffffffdf97,
                              CONCAT16(in_stack_ffffffffffffdf96,
                                       CONCAT15(in_stack_ffffffffffffdf95,in_stack_ffffffffffffdf90)
                                      )),in_stack_ffffffffffffdf88);
          std::__cxx11::string::~string(local_1cc0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1cc1);
          local_4 = 1;
          local_ff0 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_1ca0);
          goto LAB_001057e1;
        }
        if ((local_29 & 1) != 0) {
          in_stack_ffffffffffffddd8 = local_11e0;
          local_1cd8 = (double *)std::vector<double,_std::allocator<double>_>::begin(pvVar5);
          local_1ce0 = (double *)std::vector<double,_std::allocator<double>_>::end(pvVar5);
          __last_00._M_current._7_1_ = in_stack_ffffffffffffddaf;
          __last_00._M_current._0_7_ = in_stack_ffffffffffffdda8;
          in_stack_ffffffffffffdde0 =
               (ostream *)
               std::
               accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                         (in_stack_ffffffffffffddb0,__last_00,in_stack_ffffffffffffdda0.z);
          local_1cd0 = in_stack_ffffffffffffdde0;
          if (((double)in_stack_ffffffffffffdde0 == 0.0) &&
             (!NAN((double)in_stack_ffffffffffffdde0))) {
            std::__cxx11::ostringstream::ostringstream(local_1e58);
            poVar4 = std::operator<<((ostream *)local_1e58,
                                     "Failed to calculate normalized histogram at ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1b28);
            std::operator<<(poVar4,"th frame");
            paVar6 = &local_1e79;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1e78,"histogram",paVar6);
            sptk::PrintErrorMessage
                      ((string *)
                       CONCAT17(in_stack_ffffffffffffdf97,
                                CONCAT16(in_stack_ffffffffffffdf96,
                                         CONCAT15(in_stack_ffffffffffffdf95,
                                                  in_stack_ffffffffffffdf90))),
                       in_stack_ffffffffffffdf88);
            std::__cxx11::string::~string(local_1e78);
            std::allocator<char>::~allocator((allocator<char> *)&local_1e79);
            local_4 = 1;
            local_ff0 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_1e58);
            goto LAB_001057e1;
          }
          local_1e88 = 1.0 / (double)in_stack_ffffffffffffdde0;
          in_stack_ffffffffffffddb0._M_current = (double *)local_11e0;
          local_1e90 = (double *)std::vector<double,_std::allocator<double>_>::begin(pvVar5);
          local_1e98 = (double *)std::vector<double,_std::allocator<double>_>::end(pvVar5);
          local_1ea0 = (double *)std::vector<double,_std::allocator<double>_>::begin(pvVar5);
          local_1ea8 = local_1e88;
          __result_00._M_current._7_1_ = in_stack_ffffffffffffddaf;
          __result_00._M_current._0_7_ = in_stack_ffffffffffffdda8;
          in_stack_ffffffffffffddb8 =
               std::
               transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,main::__1>
                         (in_stack_ffffffffffffddb8,in_stack_ffffffffffffddb0,__result_00,
                          in_stack_ffffffffffffdda0);
          local_1eb0 = in_stack_ffffffffffffddb8._M_current;
        }
        in_stack_ffffffffffffddaf =
             sptk::WriteStream<double>
                       (in_stack_ffffffffffffddf0,(int)((ulong)in_stack_ffffffffffffdde8 >> 0x20),
                        (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdde0,
                        in_stack_ffffffffffffddd8,in_stack_ffffffffffffddd0);
        if (!(bool)in_stack_ffffffffffffddaf) {
          std::__cxx11::ostringstream::ostringstream(local_2028);
          std::operator<<((ostream *)local_2028,"Failed to write histogram");
          paVar6 = &local_2049;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2048,"histogram",paVar6);
          sptk::PrintErrorMessage
                    ((string *)
                     CONCAT17(in_stack_ffffffffffffdf97,
                              CONCAT16(in_stack_ffffffffffffdf96,
                                       CONCAT15(in_stack_ffffffffffffdf95,in_stack_ffffffffffffdf90)
                                      )),in_stack_ffffffffffffdf88);
          std::__cxx11::string::~string(local_2048);
          std::allocator<char>::~allocator((allocator<char> *)&local_2049);
          local_4 = 1;
          local_ff0 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_2028);
          goto LAB_001057e1;
        }
        local_1b28 = local_1b28 + 1;
      }
      local_ff0 = 0;
LAB_001057e1:
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffddb0._M_current);
    }
    if (local_ff0 == 0) {
      local_4 = 0;
      local_ff0 = 1;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffddb0._M_current);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_11a0);
    std::operator<<((ostream *)local_11a0,"Failed to initialize HistogramCalculation");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_11c0,"histogram",&local_11c1);
    sptk::PrintErrorMessage
              ((string *)
               CONCAT17(in_stack_ffffffffffffdf97,
                        CONCAT16(in_stack_ffffffffffffdf96,
                                 CONCAT15(in_stack_ffffffffffffdf95,in_stack_ffffffffffffdf90))),
               in_stack_ffffffffffffdf88);
    std::__cxx11::string::~string(local_11c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_11c1);
    local_4 = 1;
    local_ff0 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_11a0);
  }
  sptk::HistogramCalculation::~HistogramCalculation(&local_1028);
LAB_0010585e:
  std::ifstream::~ifstream(local_e50);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int output_interval(kMagicNumberForEndOfFile);
  int num_bin(kDefaultNumBin);
  double lower_bound(kDefaultLowerBound);
  double upper_bound(kDefaultUpperBound);
  bool normalization_flag(kDefaultNormalizationFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "t:b:l:u:nh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 't': {
        if (!sptk::ConvertStringToInteger(optarg, &output_interval) ||
            output_interval <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -t option must be a positive integer";
          sptk::PrintErrorMessage("histogram", error_message);
          return 1;
        }
        break;
      }
      case 'b': {
        if (!sptk::ConvertStringToInteger(optarg, &num_bin) || num_bin <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -b option must be a positive integer";
          sptk::PrintErrorMessage("histogram", error_message);
          return 1;
        }
        break;
      }
      case 'l': {
        if (!sptk::ConvertStringToDouble(optarg, &lower_bound)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be numeric";
          sptk::PrintErrorMessage("histogram", error_message);
          return 1;
        }
        break;
      }
      case 'u': {
        if (!sptk::ConvertStringToDouble(optarg, &upper_bound)) {
          std::ostringstream error_message;
          error_message << "The argument for the -u option must be numeric";
          sptk::PrintErrorMessage("histogram", error_message);
          return 1;
        }
        break;
      }
      case 'n': {
        normalization_flag = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (upper_bound <= lower_bound) {
    std::ostringstream error_message;
    error_message << "Upper bound must be greater than lower bound";
    sptk::PrintErrorMessage("histogram", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("histogram", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("histogram", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("histogram", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::HistogramCalculation histogram_calculation(num_bin, lower_bound,
                                                   upper_bound);
  if (!histogram_calculation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize HistogramCalculation";
    sptk::PrintErrorMessage("histogram", error_message);
    return 1;
  }

  std::vector<double> histogram(num_bin);

  if (kMagicNumberForEndOfFile == output_interval) {
    std::vector<double> data(1);
    sptk::StatisticsAccumulation statistics_accumulation(num_bin - 1, 1);
    sptk::StatisticsAccumulation::Buffer buffer;
    while (sptk::ReadStream(false, 0, 0, 1, &data, &input_stream, NULL)) {
      if (!histogram_calculation.Run(data, &histogram)) {
        std::ostringstream error_message;
        error_message << "Failed to calculate histogram";
        sptk::PrintErrorMessage("histogram", error_message);
        return 1;
      }
      if (!statistics_accumulation.Run(histogram, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to accumulate histogram";
        sptk::PrintErrorMessage("histogram", error_message);
        return 1;
      }
    }

    if (!statistics_accumulation.GetSum(buffer, &histogram)) {
      std::ostringstream error_message;
      error_message << "Failed to get histogram";
      sptk::PrintErrorMessage("histogram", error_message);
      return 1;
    }

    if (normalization_flag) {
      const double sum(
          std::accumulate(histogram.begin(), histogram.end(), 0.0));
      if (0.0 == sum) {
        std::ostringstream error_message;
        error_message << "Failed to calculate normalized histogram";
        sptk::PrintErrorMessage("histogram", error_message);
        return 1;
      }
      const double z(1.0 / sum);
      std::transform(histogram.begin(), histogram.end(), histogram.begin(),
                     [z](double x) { return x * z; });
    }

    if (!sptk::WriteStream(0, num_bin, histogram, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write histogram";
      sptk::PrintErrorMessage("histogram", error_message);
      return 1;
    }
  } else {
    std::vector<double> data(output_interval);
    for (int frame_index(0); sptk::ReadStream(false, 0, 0, output_interval,
                                              &data, &input_stream, NULL);
         ++frame_index) {
      if (!histogram_calculation.Run(data, &histogram)) {
        std::ostringstream error_message;
        error_message << "Failed to calculate histogram";
        sptk::PrintErrorMessage("histogram", error_message);
        return 1;
      }

      if (normalization_flag) {
        const double sum(
            std::accumulate(histogram.begin(), histogram.end(), 0.0));
        if (0.0 == sum) {
          std::ostringstream error_message;
          error_message << "Failed to calculate normalized histogram at "
                        << frame_index << "th frame";
          sptk::PrintErrorMessage("histogram", error_message);
          return 1;
        }
        const double z(1.0 / sum);
        std::transform(histogram.begin(), histogram.end(), histogram.begin(),
                       [z](double x) { return x * z; });
      }

      if (!sptk::WriteStream(0, num_bin, histogram, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write histogram";
        sptk::PrintErrorMessage("histogram", error_message);
        return 1;
      }
    }
  }

  return 0;
}